

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O2

void soul::Optimisations::makeFunctionCallInline
               (Program *program,Function *parentFunction,size_t blockIndex,FunctionCall *call)

{
  bool bVar1;
  Function *pFVar2;
  Module *m;
  Inliner local_108;
  
  bVar1 = heart::Utilities::canFunctionBeInlined(program,parentFunction,call);
  if (!bVar1) {
    throwInternalCompilerError
              ("heart::Utilities::canFunctionBeInlined (program, parentFunction, call)",
               "makeFunctionCallInline",0xdf);
  }
  local_108.module = (Module *)call;
  bVar1 = contains<soul::LinkedList<soul::heart::Statement>,soul::heart::FunctionCall*>
                    (&((parentFunction->blocks).
                       super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[blockIndex].object)->statements,
                     (FunctionCall **)&local_108);
  if (bVar1) {
    pFVar2 = pool_ptr<soul::heart::Function>::operator*(&call->function);
    m = Program::getModuleContainingFunction(program,pFVar2);
    pFVar2 = pool_ptr<soul::heart::Function>::operator*(&call->function);
    Inliner::Inliner(&local_108,m,parentFunction,blockIndex,call,pFVar2);
    Inliner::perform(&local_108);
    Inliner::~Inliner(&local_108);
    return;
  }
  throwInternalCompilerError
            ("contains (parentFunction.blocks[blockIndex]->statements, std::addressof (call))",
             "makeFunctionCallInline",0xe0);
}

Assistant:

static void makeFunctionCallInline (Program& program, heart::Function& parentFunction,
                                        size_t blockIndex, heart::FunctionCall& call)
    {
        SOUL_ASSERT (heart::Utilities::canFunctionBeInlined (program, parentFunction, call));
        SOUL_ASSERT (contains (parentFunction.blocks[blockIndex]->statements, std::addressof (call)));

        Inliner (program.getModuleContainingFunction (call.getFunction()),
                 parentFunction, blockIndex, call, call.getFunction()).perform();
    }